

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

void __thiscall APITests::test_gpio_function_out(APITests *this)

{
  string *in_RDI;
  undefined1 unaff_retaddr;
  Directions val;
  allocator local_31;
  string local_30 [36];
  undefined4 local_c;
  string *msg;
  
  msg = in_RDI;
  GPIO::setmode(BOARD);
  GPIO::setup(*(int *)(in_RDI + 0x20),OUT,-1);
  local_c = GPIO::gpio_function(*(int *)(in_RDI + 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  assert::is_true((bool)unaff_retaddr,msg);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  GPIO::cleanup();
  return;
}

Assistant:

void test_gpio_function_out()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.out_a, GPIO::OUT);
        auto val = GPIO::gpio_function(pin_data.out_a);
        assert::is_true(val == GPIO::Directions::OUT);
        GPIO::cleanup();
    }